

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_item.cpp
# Opt level: O3

int menu_item_left_offset_internal(Am_Widget_Look *look,bool menuBarItem)

{
  Am_Widget_Look_vals AVar1;
  int iVar2;
  
  AVar1 = look->value;
  if (AVar1 == Am_MACINTOSH_LOOK_val) {
    return (uint)!menuBarItem * 4 + 0xb;
  }
  if (AVar1 != Am_WINDOWS_LOOK_val) {
    if (AVar1 == Am_MOTIF_LOOK_val) {
      iVar2 = 0xf;
      if (menuBarItem) {
        iVar2 = 5;
      }
      return iVar2;
    }
    Am_Error("Unknown Look parameter");
  }
  return (uint)!menuBarItem << 4 | 6;
}

Assistant:

int
menu_item_left_offset_internal(Am_Widget_Look &look, bool menuBarItem)
{
  switch (look.value) {
  case Am_MOTIF_LOOK_val:
    return menuBarItem ? 5 : 15; //formerly 5

  case Am_WINDOWS_LOOK_val:
    return menuBarItem ? 6 : 22;

  case Am_MACINTOSH_LOOK_val:
    return menuBarItem ? 11 : 15;

  default:
    Am_Error("Unknown Look parameter");
    break;
  }
  return 2; // we should never get here
}